

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_upper_bounds.cpp
# Opt level: O0

void __thiscall
despot::LookaheadUpperBound::LookaheadUpperBound
          (LookaheadUpperBound *this,DSPOMDP *model,StateIndexer *indexer,ParticleUpperBound *bound)

{
  ParticleUpperBound *bound_local;
  StateIndexer *indexer_local;
  DSPOMDP *model_local;
  LookaheadUpperBound *this_local;
  
  ScenarioUpperBound::ScenarioUpperBound(&this->super_ScenarioUpperBound);
  (this->super_ScenarioUpperBound)._vptr_ScenarioUpperBound =
       (_func_int **)&PTR__LookaheadUpperBound_0026e518;
  this->model_ = model;
  this->indexer_ = indexer;
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector(&this->bounds_);
  this->particle_upper_bound_ = bound;
  return;
}

Assistant:

LookaheadUpperBound::LookaheadUpperBound(const DSPOMDP* model,
	const StateIndexer& indexer, ParticleUpperBound* bound) :
	model_(model),
	indexer_(indexer),
	particle_upper_bound_(bound) {
}